

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
preciseunitOps_flagClearSetIflag_Test::~preciseunitOps_flagClearSetIflag_Test
          (preciseunitOps_flagClearSetIflag_Test *this)

{
  preciseunitOps_flagClearSetIflag_Test *this_local;
  
  ~preciseunitOps_flagClearSetIflag_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseunitOps, flagClearSetIflag)
{
    precise_unit m1(0.245, precise::yd);
    auto m2 = m1.add_i_flag();
    EXPECT_TRUE(m2.has_i_flag());
    EXPECT_FALSE(m1.is_exactly_the_same(m2));
    auto m3 = m2.clear_i_flag();
    EXPECT_FALSE(m3.has_i_flag());
    EXPECT_TRUE(m1.is_exactly_the_same(m3));
    m2.clear_flags();
    EXPECT_TRUE(m2.is_exactly_the_same(m1));
}